

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_to_line_spectral_pairs.cc
# Opt level: O1

bool __thiscall
sptk::LinearPredictiveCoefficientsToLineSpectralPairs::Run
          (LinearPredictiveCoefficientsToLineSpectralPairs *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *line_spectral_pairs,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  int iVar2;
  double *pdVar3;
  pointer pdVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double *pdVar8;
  bool bVar9;
  size_type sVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  vector<double,_std::allocator<double>_> *coefficients;
  int iVar16;
  int iVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double x;
  double dVar25;
  double dVar26;
  double dVar27;
  double local_b8;
  double local_b0;
  double local_98;
  
  if (this->is_valid_ == true) {
    bVar9 = false;
    if (((buffer != (Buffer *)0x0) &&
        (bVar9 = false, line_spectral_pairs != (vector<double,_std::allocator<double>_> *)0x0)) &&
       (sVar10 = (long)this->num_order_ + 1,
       (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3 == sVar10)) {
      if ((long)(line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != sVar10) {
        std::vector<double,_std::allocator<double>_>::resize(line_spectral_pairs,sVar10);
      }
      this_00 = &buffer->c1_;
      sVar10 = (long)this->num_symmetric_polynomial_order_ + 1;
      if ((long)(buffer->c1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->c1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != sVar10) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,sVar10);
      }
      this_01 = &buffer->c2_;
      sVar10 = (long)this->num_asymmetric_polynomial_order_ + 1;
      if ((long)(buffer->c2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->c2_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != sVar10) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,sVar10);
      }
      pdVar3 = (linear_predictive_coefficients->super__Vector_base<double,_std::allocator<double>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (line_spectral_pairs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *pdVar4 = *pdVar3;
      uVar13 = (ulong)this->num_order_;
      if (uVar13 == 0) {
        bVar9 = true;
      }
      else {
        pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar16 = this->num_symmetric_polynomial_order_;
        pdVar5[iVar16] = 1.0;
        iVar2 = this->num_asymmetric_polynomial_order_;
        lVar15 = (long)iVar2;
        pdVar6[lVar15] = 1.0;
        pdVar11 = pdVar3 + 1;
        pdVar8 = pdVar3 + uVar13;
        if ((uVar13 & 1) == 0) {
          if (0 < iVar16) {
            lVar15 = (long)iVar16 + 1;
            do {
              pdVar5[lVar15 + -2] = (*pdVar11 + *pdVar8) - pdVar5[lVar15 + -1];
              pdVar6[lVar15 + -2] = (*pdVar11 - *pdVar8) + pdVar6[lVar15 + -1];
              pdVar11 = pdVar11 + 1;
              pdVar8 = pdVar8 + -1;
              lVar15 = lVar15 + -1;
            } while (1 < lVar15);
          }
        }
        else {
          if (0 < iVar2) {
            lVar14 = lVar15 + 1;
            lVar12 = 0;
            do {
              *(double *)((long)pdVar5 + lVar12 + lVar15 * 8) =
                   *pdVar11 + *(double *)((long)pdVar8 + lVar12);
              dVar24 = *pdVar11 - *(double *)((long)pdVar8 + lVar12);
              if (lVar12 != 0) {
                dVar24 = dVar24 + *(double *)((long)pdVar6 + lVar12 + lVar15 * 8 + 8);
              }
              *(double *)((long)pdVar6 + lVar12 + lVar15 * 8 + -8) = dVar24;
              pdVar11 = pdVar11 + 1;
              lVar14 = lVar14 + -1;
              lVar12 = lVar12 + -8;
            } while (1 < lVar14);
            pdVar11 = (double *)((long)pdVar3 + (8 - lVar12));
            pdVar8 = (double *)((long)pdVar8 + lVar12);
          }
          *pdVar5 = *pdVar11 + *pdVar8;
        }
        *pdVar5 = *pdVar5 * 0.5;
        *pdVar6 = *pdVar6 * 0.5;
        local_b0 = anon_unknown.dwarf_c0e5::CalculateChebyshevPolynomial(this_00,1.0);
        dVar23 = 1.0 / (double)this->num_split_;
        dVar19 = -1.0 - dVar23;
        iVar16 = 0;
        dVar24 = 1.0;
        local_b8 = 1.0;
        coefficients = this_00;
        do {
          dVar24 = dVar24 - dVar23;
          if (dVar24 <= dVar19) {
            return dVar19 < dVar24;
          }
          dVar20 = anon_unknown.dwarf_c0e5::CalculateChebyshevPolynomial(coefficients,dVar24);
          bVar9 = true;
          if (dVar20 * local_b0 <= 0.0) {
            iVar2 = this->num_iteration_;
            dVar22 = local_b0;
            dVar27 = local_b8;
            dVar25 = dVar24;
            local_98 = dVar20;
            if (0 < iVar2) {
              dVar1 = this->convergence_threshold_;
              dVar26 = local_b0;
              iVar17 = 1;
              do {
                x = (dVar25 + dVar27) * 0.5;
                dVar21 = anon_unknown.dwarf_c0e5::CalculateChebyshevPolynomial(coefficients,x);
                dVar22 = dVar21;
                dVar7 = x;
                if (dVar26 * dVar21 <= 0.0) {
                  dVar22 = dVar26;
                  dVar7 = dVar27;
                  local_98 = dVar21;
                }
                dVar27 = dVar7;
                uVar13 = -(ulong)(0.0 < dVar26 * dVar21);
                dVar25 = (double)(uVar13 & (ulong)dVar25 | ~uVar13 & (ulong)x);
              } while ((dVar1 < ABS(dVar21)) &&
                      (bVar18 = iVar17 < iVar2, dVar26 = dVar22, iVar17 = iVar17 + 1, bVar18));
            }
            dVar27 = (dVar27 * local_98 - dVar25 * dVar22) / (local_98 - dVar22);
            dVar22 = acos(dVar27);
            lVar15 = (long)iVar16;
            iVar16 = iVar16 + 1;
            pdVar4[lVar15 + 1] = dVar22 / 6.283185307179586;
            iVar2 = this->num_order_;
            if (iVar2 != iVar16) {
              bVar18 = coefficients == this_00;
              coefficients = this_00;
              if (bVar18) {
                coefficients = this_01;
              }
              dVar20 = anon_unknown.dwarf_c0e5::CalculateChebyshevPolynomial(coefficients,dVar27);
              dVar24 = dVar27;
            }
            if (iVar2 != iVar16) goto LAB_00105c83;
            bVar18 = false;
          }
          else {
LAB_00105c83:
            bVar18 = true;
            local_b8 = dVar24;
            local_b0 = dVar20;
          }
        } while (bVar18);
      }
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool LinearPredictiveCoefficientsToLineSpectralPairs::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* line_spectral_pairs,
    LinearPredictiveCoefficientsToLineSpectralPairs::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == line_spectral_pairs || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (line_spectral_pairs->size() != static_cast<std::size_t>(num_order_ + 1)) {
    line_spectral_pairs->resize(num_order_ + 1);
  }
  if (buffer->c1_.size() !=
      static_cast<std::size_t>(num_symmetric_polynomial_order_ + 1)) {
    buffer->c1_.resize(num_symmetric_polynomial_order_ + 1);
  }
  if (buffer->c2_.size() !=
      static_cast<std::size_t>(num_asymmetric_polynomial_order_ + 1)) {
    buffer->c2_.resize(num_asymmetric_polynomial_order_ + 1);
  }

  // Copy gain.
  (*line_spectral_pairs)[0] = linear_predictive_coefficients[0];
  if (0 == num_order_) return true;

  // Calculate symmetric and antisymmetric polynomials.
  double* c1(&buffer->c1_[0]);
  double* c2(&buffer->c2_[0]);
  {
    c1[num_symmetric_polynomial_order_] = 1.0;
    c2[num_asymmetric_polynomial_order_] = 1.0;
    const double* p1(&(linear_predictive_coefficients[0]) + 1);
    const double* p2(&(linear_predictive_coefficients[0]) + num_order_);
    if (num_order_ % 2 == 0) {
      for (int i(num_symmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i] = *p1 + *p2 - c1[i + 1];
        c2[i] = *p1 - *p2 + c2[i + 1];
      }
    } else {
      for (int i(num_asymmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i + 1] = *p1 + *p2;
        c2[i] = (i == num_asymmetric_polynomial_order_ - 1)
                    ? *p1 - *p2
                    : *p1 - *p2 + c2[i + 2];
      }
      c1[0] = *p1 + *p2;
    }
    c1[0] *= 0.5;
    c2[0] *= 0.5;
  }

  const std::vector<double>* c(&buffer->c1_);
  int order(0);
  double x_prev(1.0);
  double y_prev(CalculateChebyshevPolynomial(*c, x_prev));
  double* w(&((*line_spectral_pairs)[0]));

  // Search roots of polynomials.
  const double delta(1.0 / num_split_);
  const double x_max(1.0 - delta);
  const double x_min(-1.0 - delta);
  for (double x(x_max); x_min < x; x -= delta) {
    double y(CalculateChebyshevPolynomial(*c, x));

    if (y * y_prev <= 0.0) {
      double x_lower(x);
      double x_upper(x_prev);
      double y_lower(y);
      double y_upper(y_prev);

      for (int n(0); n < num_iteration_; ++n) {
        const double x_mid((x_lower + x_upper) * 0.5);
        const double y_mid(CalculateChebyshevPolynomial(*c, x_mid));

        if (y_mid * y_upper <= 0.0) {
          x_lower = x_mid;
          y_lower = y_mid;
        } else {
          x_upper = x_mid;
          y_upper = y_mid;
        }

        if (std::fabs(y_mid) <= convergence_threshold_) {
          break;
        }
      }

      const double x_interpolated((y_lower * x_upper - y_upper * x_lower) /
                                  (y_lower - y_upper));
      w[++order] = std::acos(x_interpolated) / sptk::kTwoPi;
      if (num_order_ == order) return true;

      // Update variables.
      c = (c == &buffer->c1_) ? &buffer->c2_ : &buffer->c1_;
      x = x_interpolated;
      y = CalculateChebyshevPolynomial(*c, x);
    }

    x_prev = x;
    y_prev = y;
  }

  return false;
}